

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O2

int mbedtls_x509_get_ext(uchar **p,uchar *end,mbedtls_x509_buf *ext,int tag)

{
  int iVar1;
  uchar *puVar2;
  size_t len;
  
  if (*p != end) {
    ext->tag = (uint)**p;
    iVar1 = mbedtls_asn1_get_tag(p,end,&ext->len,tag | 0xa0);
    if (iVar1 == 0) {
      puVar2 = *p;
      ext->p = puVar2;
      puVar2 = puVar2 + ext->len;
      iVar1 = mbedtls_asn1_get_tag(p,puVar2,&len,0x30);
      if (iVar1 == 0) {
        iVar1 = -0x2566;
        if (puVar2 == *p + len) {
          iVar1 = 0;
        }
      }
      else {
        iVar1 = iVar1 + -0x2500;
      }
    }
    return iVar1;
  }
  return 0;
}

Assistant:

int mbedtls_x509_get_ext( unsigned char **p, const unsigned char *end,
                  mbedtls_x509_buf *ext, int tag )
{
    int ret;
    size_t len;

    if( *p == end )
        return( 0 );

    ext->tag = **p;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &ext->len,
            MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | tag ) ) != 0 )
        return( ret );

    ext->p = *p;
    end = *p + ext->len;

    /*
     * Extensions  ::=  SEQUENCE SIZE (1..MAX) OF Extension
     *
     * Extension  ::=  SEQUENCE  {
     *      extnID      OBJECT IDENTIFIER,
     *      critical    BOOLEAN DEFAULT FALSE,
     *      extnValue   OCTET STRING  }
     */
    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

    if( end != *p + len )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}